

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O3

uint __thiscall BVFixed::DiffCount(BVFixed *this,BVFixed *bv)

{
  BVFixed *pBVar1;
  BVFixed *pBVar2;
  BVIndex BVar3;
  uint uVar4;
  BVFixed *pBVar5;
  BVFixed *pBVar6;
  uint uVar7;
  
  pBVar1 = this + 1;
  pBVar2 = bv + 1;
  WordCount(this->len);
  uVar7 = 0;
  pBVar5 = pBVar1;
  pBVar6 = pBVar2;
  do {
    BVar3 = WordCount(bv->len);
    if (pBVar6 == pBVar2 + BVar3) break;
    BVar3 = BVUnitT<unsigned_long>::CountBit((ulong)*pBVar5 ^ (ulong)*pBVar6);
    uVar7 = uVar7 + BVar3;
    pBVar5 = pBVar5 + 1;
    pBVar6 = pBVar6 + 1;
    BVar3 = WordCount(this->len);
  } while (pBVar5 != pBVar1 + BVar3);
  for (; BVar3 = WordCount(this->len), pBVar5 != pBVar1 + BVar3; pBVar5 = pBVar5 + 1) {
    BVar3 = BVUnitT<unsigned_long>::CountBit((UnitWord64)*pBVar5);
    uVar7 = uVar7 + BVar3;
  }
  uVar4 = WordCount(bv->len);
  for (; pBVar6 != pBVar2 + uVar4; pBVar6 = pBVar6 + 1) {
    BVar3 = BVUnitT<unsigned_long>::CountBit((UnitWord64)*pBVar6);
    uVar7 = uVar7 + BVar3;
    uVar4 = WordCount(bv->len);
  }
  return uVar7;
}

Assistant:

uint
BVFixed::DiffCount(const BVFixed*bv) const
{
    const BVUnit *i, *j;
    uint count = 0;
    for(i  =  this->BeginUnit(), j = bv->BeginUnit();
        i !=  this->EndUnit() && j != bv->EndUnit();
        i++, j++)
    {
        count += i->DiffCount(*j);
    }

    // Assumes that the default value of is 0
    while(i != this->EndUnit())
    {
        count += i->Count();
        i++;
    }
    while(j != bv->EndUnit())
    {
        count += j->Count();
        j++;
    }
    return count;
}